

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O0

void __thiscall
WriterTestHelper<unsigned_char,_3U,_32849U>::texinfo::resize
          (texinfo *this,GLuint levels,GLuint layers,GLuint faces,GLuint dimensions,bool array,
          GLsizei width,GLsizei height,GLsizei depth)

{
  ktx_uint32_t local_34;
  ktx_uint32_t local_30;
  ktx_uint32_t local_2c;
  bool array_local;
  GLuint dimensions_local;
  GLuint faces_local;
  GLuint layers_local;
  GLuint levels_local;
  texinfo *this_local;
  
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.numLayers = layers;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.numFaces = faces;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.numLevels = levels;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.numDimensions = dimensions;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.generateMipmaps = false;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.isArray = array;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.baseWidth = width;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.baseHeight = height;
  (this->super_wthTexInfo).super_ktxTextureCreateInfo.baseDepth = depth;
  if (((this->super_wthTexInfo).super_ktxTextureCreateInfo.isArray & 1U) == 0) {
    local_2c = 0;
  }
  else {
    local_2c = (this->super_wthTexInfo).super_ktxTextureCreateInfo.numLayers;
  }
  (this->super_wthTexInfo).headerNumLayers = local_2c;
  if ((this->super_wthTexInfo).super_ktxTextureCreateInfo.numDimensions < 2) {
    local_30 = 0;
  }
  else {
    local_30 = height;
  }
  (this->super_wthTexInfo).headerPixelHeight = local_30;
  if ((this->super_wthTexInfo).super_ktxTextureCreateInfo.numDimensions == 3) {
    local_34 = depth;
  }
  else {
    local_34 = 0;
  }
  (this->super_wthTexInfo).headerPixelDepth = local_34;
  return;
}

Assistant:

void resize(GLuint levels, GLuint layers, GLuint faces,
                    GLuint dimensions, bool array,
                    GLsizei width, GLsizei height, GLsizei depth) {
            this->numLayers = layers;
            this->numFaces = faces;
            this->numLevels = levels;
            this->numDimensions = dimensions;
            this->generateMipmaps = false;
            this->isArray = array;
            baseWidth = width;
            baseHeight = height;
            baseDepth = depth;
            headerNumLayers = isArray ? numLayers: 0;
            headerPixelHeight = numDimensions >= 2 ? height : 0;
            headerPixelDepth = numDimensions == 3 ? depth : 0;
       }